

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f::BuildLogTestMultiTargetEdge::Run(BuildLogTestMultiTargetEdge *this)

{
  Test *pTVar1;
  bool bVar2;
  LogEntry *__rhs;
  LogEntry *__rhs_00;
  allocator<char> local_a9;
  string local_a8;
  BuildLog log;
  
  AssertParse(&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_,
              "build out out.d: cat\n",(ManifestParserOptions)0x0);
  BuildLog::BuildLog(&log);
  BuildLog::RecordCommand
            (&log,*(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.edges_.
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start,0x15,0x16,0);
  bVar2 = testing::Test::Check
                    (g_current_test,log.entries_._M_h._M_element_count == 2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                     ,0x131,"2u == log.entries().size()");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"out",&local_a9);
    __rhs = BuildLog::LookupByOutput(&log,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar2 = testing::Test::Check
                      (g_current_test,__rhs != (LogEntry *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                       ,0x133,"e1");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"out.d",&local_a9);
      __rhs_00 = BuildLog::LookupByOutput(&log,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      bVar2 = testing::Test::Check
                        (g_current_test,__rhs_00 != (LogEntry *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                         ,0x135,"e2");
      pTVar1 = g_current_test;
      if (bVar2) {
        bVar2 = std::operator==("out",&__rhs->output);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                           ,0x136,"\"out\" == e1->output");
        pTVar1 = g_current_test;
        if (bVar2) {
          bVar2 = std::operator==("out.d",&__rhs_00->output);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                             ,0x137,"\"out.d\" == e2->output");
          if ((((bVar2) &&
               (bVar2 = testing::Test::Check
                                  (g_current_test,__rhs->start_time == 0x15,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                   ,0x138,"21 == e1->start_time"), bVar2)) &&
              (bVar2 = testing::Test::Check
                                 (g_current_test,__rhs_00->start_time == 0x15,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                  ,0x139,"21 == e2->start_time"), bVar2)) &&
             ((bVar2 = testing::Test::Check
                                 (g_current_test,__rhs_00->end_time == 0x16,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                  ,0x13a,"22 == e2->end_time"), bVar2 &&
              (bVar2 = testing::Test::Check
                                 (g_current_test,__rhs_00->end_time == 0x16,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_log_test.cc"
                                  ,0x13b,"22 == e2->end_time"), bVar2)))) goto LAB_0011d1c4;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0011d1c4:
  BuildLog::~BuildLog(&log);
  return;
}

Assistant:

TEST_F(BuildLogTest, MultiTargetEdge) {
  AssertParse(&state_,
"build out out.d: cat\n");

  BuildLog log;
  log.RecordCommand(state_.edges_[0], 21, 22);

  ASSERT_EQ(2u, log.entries().size());
  BuildLog::LogEntry* e1 = log.LookupByOutput("out");
  ASSERT_TRUE(e1);
  BuildLog::LogEntry* e2 = log.LookupByOutput("out.d");
  ASSERT_TRUE(e2);
  ASSERT_EQ("out", e1->output);
  ASSERT_EQ("out.d", e2->output);
  ASSERT_EQ(21, e1->start_time);
  ASSERT_EQ(21, e2->start_time);
  ASSERT_EQ(22, e2->end_time);
  ASSERT_EQ(22, e2->end_time);
}